

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniqueNameGenerator.cpp
# Opt level: O0

void __thiscall
Assimp::MDL::HalfLife::UniqueNameGenerator::UniqueNameGenerator(UniqueNameGenerator *this)

{
  allocator<char> local_25 [20];
  allocator<char> local_11;
  UniqueNameGenerator *local_10;
  UniqueNameGenerator *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,"unnamed",&local_11);
  std::allocator<char>::~allocator(&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->separator_,"_",local_25);
  std::allocator<char>::~allocator(local_25);
  return;
}

Assistant:

UniqueNameGenerator::UniqueNameGenerator() :
    template_name_("unnamed"),
    separator_("_") {
}